

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O1

RSA * RSA_parse_private_key(CBS *cbs)

{
  int iVar1;
  RSA *r;
  int line;
  CBS child;
  uint64_t version;
  CBS CStack_28;
  uint64_t local_18;
  
  r = (RSA *)RSA_new();
  if (r == (RSA *)0x0) {
    return (RSA *)0x0;
  }
  iVar1 = CBS_get_asn1(cbs,&CStack_28,0x20000010);
  if ((iVar1 == 0) || (iVar1 = CBS_get_asn1_uint64(&CStack_28,&local_18), iVar1 == 0)) {
    iVar1 = 100;
    line = 0x7d;
  }
  else if (local_18 == 0) {
    iVar1 = parse_integer(&CStack_28,&r->n);
    if (((((iVar1 == 0) || (iVar1 = parse_integer(&CStack_28,&r->e), iVar1 == 0)) ||
         (iVar1 = parse_integer(&CStack_28,&r->d), iVar1 == 0)) ||
        ((iVar1 = parse_integer(&CStack_28,&r->p), iVar1 == 0 ||
         (iVar1 = parse_integer(&CStack_28,&r->q), iVar1 == 0)))) ||
       ((iVar1 = parse_integer(&CStack_28,&r->dmp1), iVar1 == 0 ||
        ((iVar1 = parse_integer(&CStack_28,&r->dmq1), iVar1 == 0 ||
         (iVar1 = parse_integer(&CStack_28,&r->iqmp), iVar1 == 0)))))) goto LAB_004d341f;
    if (CStack_28.len == 0) {
      iVar1 = RSA_check_key((RSA *)r);
      if (iVar1 != 0) {
        return r;
      }
      iVar1 = 0x68;
      line = 0x97;
    }
    else {
      iVar1 = 100;
      line = 0x92;
    }
  }
  else {
    iVar1 = 0x6a;
    line = 0x82;
  }
  ERR_put_error(4,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                ,line);
LAB_004d341f:
  RSA_free((RSA *)r);
  return (RSA *)0x0;
}

Assistant:

RSA *RSA_parse_private_key(CBS *cbs) {
  RSA *ret = RSA_new();
  if (ret == NULL) {
    return NULL;
  }

  CBS child;
  uint64_t version;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&child, &version)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    goto err;
  }

  if (version != kVersionTwoPrime) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_VERSION);
    goto err;
  }

  if (!parse_integer(&child, &ret->n) ||
      !parse_integer(&child, &ret->e) ||
      !parse_integer(&child, &ret->d) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->dmp1) ||
      !parse_integer(&child, &ret->dmq1) ||
      !parse_integer(&child, &ret->iqmp)) {
    goto err;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    goto err;
  }

  if (!RSA_check_key(ret)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_RSA_PARAMETERS);
    goto err;
  }

  return ret;

err:
  RSA_free(ret);
  return NULL;
}